

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# directory.cpp
# Opt level: O3

void __thiscall directory::directory(directory *this,string *typeName)

{
  size_t in_RCX;
  void *extraout_RDX;
  void *extraout_RDX_00;
  void *__buf;
  fstream directoryFile;
  string local_250;
  undefined1 local_230 [528];
  
  this->depth = 1;
  this->bucket_size = 2;
  (this->typeName)._M_dataplus._M_p = (pointer)&(this->typeName).field_2;
  (this->typeName)._M_string_length = 0;
  (this->typeName).field_2._M_local_buf[0] = '\0';
  (this->bucket_ids).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->bucket_ids).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->bucket_ids).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::__cxx11::string::_M_assign((string *)&this->typeName);
  generateDirectoryFileName(&local_250,typeName);
  std::fstream::fstream(local_230,(string *)&local_250,_S_out|_S_in|_S_bin);
  __buf = extraout_RDX;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_250._M_dataplus._M_p != &local_250.field_2) {
    operator_delete(local_250._M_dataplus._M_p,local_250.field_2._M_allocated_capacity + 1);
    __buf = extraout_RDX_00;
  }
  read(this,(int)local_230,__buf,in_RCX);
  std::fstream::~fstream(local_230);
  return;
}

Assistant:

directory::directory(std::string typeName) {

    this->typeName = typeName;

    fstream directoryFile(generateDirectoryFileName(typeName), INOUTBIN);

    this->read(directoryFile);
}